

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.h
# Opt level: O2

LastLevelTable * __thiscall
GmmLib::MidLevelTable::GetL1Table(MidLevelTable *this,GMM_GFX_SIZE_T L2eIdx,LastLevelTable **Prev)

{
  LastLevelTable *pLVar1;
  LastLevelTable *pLVar2;
  LastLevelTable **ppLVar3;
  
  ppLVar3 = &this->pTTL1;
  pLVar2 = (LastLevelTable *)0x0;
  while( true ) {
    pLVar1 = *ppLVar3;
    if ((pLVar1 == (LastLevelTable *)0x0) || ((long)(int)pLVar1->L2eIdx == L2eIdx)) break;
    ppLVar3 = &pLVar1->pNext;
    pLVar2 = pLVar1;
  }
  if (Prev != (LastLevelTable **)0x0) {
    *Prev = pLVar2;
  }
  return pLVar1;
}

Assistant:

LastLevelTable* GetL1Table(GMM_GFX_SIZE_T L2eIdx, LastLevelTable** Prev = NULL)
        {
            LastLevelTable* pL1Tbl = pTTL1;
            LastLevelTable* PrevL1Tbl = NULL;

            while (pL1Tbl)
            {
                if (pL1Tbl->GetL2eIdx() == L2eIdx)
                {
                    break;
                }
                PrevL1Tbl = pL1Tbl;
                pL1Tbl = pL1Tbl->Next();
            }

            //if requested, save previous node in linked-list
            if (Prev)
            {
                *Prev = PrevL1Tbl;
            }
            return pL1Tbl;
        }